

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_iterator.cpp
# Opt level: O3

vector<long,_std::allocator<long>_> *
random_numbers(vector<long,_std::allocator<long>_> *__return_storage_ptr__,size_t size)

{
  pointer plVar1;
  result_type rVar2;
  size_t sVar3;
  default_random_engine generator;
  uniform_int_distribution<long> uniform;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_48;
  uniform_int_distribution<long> local_40;
  
  std::vector<long,_std::allocator<long>_>::vector
            (__return_storage_ptr__,size,(allocator_type *)&local_40);
  local_48._M_x = 1;
  local_40._M_param._M_a = 0;
  local_40._M_param._M_b = 0x7fffffffffffffff;
  if (size != 0) {
    plVar1 = (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar3 = 0;
    do {
      rVar2 = std::uniform_int_distribution<long>::operator()
                        (&local_40,&local_48,&local_40._M_param);
      plVar1[sVar3] = rVar2;
      sVar3 = sVar3 + 1;
    } while (size != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

auto random_numbers (std::size_t size)
{
    std::vector<std::int64_t> numbers(size);

    std::default_random_engine generator;
    std::uniform_int_distribution<std::int64_t> uniform;
    std::generate_n(numbers.begin(), size,
        [& uniform, & generator] {return uniform(generator);});

    return numbers;
}